

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIterator::Initialize
          (FillPatchIterator *this,int boxGrow,Real time,int idx,int scomp,int ncomp)

{
  bool bVar1;
  int iVar2;
  BoxArray *this_00;
  size_type sVar3;
  reference pvVar4;
  IndexSpace *pIVar5;
  IntVect *pIVar6;
  StateDescriptor *pSVar7;
  BATindexType in_ECX;
  IndexType in_EDX;
  int __c;
  int in_ESI;
  MFIter *__s;
  IntVect *in_RDI;
  BATType in_R8D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  MFIter mfi;
  FillPatchIteratorHelper *fph;
  int j;
  IntVect new_blocking_factor;
  int NComp;
  int SComp;
  int DComp;
  int i;
  int level;
  IndexType *boxType;
  Geometry *geom;
  StateDescriptor *desc;
  undefined8 in_stack_fffffffffffff868;
  undefined4 uVar8;
  Print *in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  StateDescriptor *in_stack_fffffffffffff880;
  StateDescriptor *in_stack_fffffffffffff890;
  FabArrayBase *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  undefined8 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  int iVar9;
  BoxArray *in_stack_fffffffffffff8b8;
  MultiFab *in_stack_fffffffffffff8c0;
  StateDescriptor *in_stack_fffffffffffff8c8;
  undefined8 uVar10;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  undefined8 uVar11;
  IndexType in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  AmrLevel *in_stack_fffffffffffff8e8;
  Print *in_stack_fffffffffffff8f0;
  undefined1 *in_stack_fffffffffffff8f8;
  Print *in_stack_fffffffffffff900;
  undefined5 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90d;
  undefined1 in_stack_fffffffffffff90e;
  undefined1 in_stack_fffffffffffff90f;
  FillPatchIterator *in_stack_fffffffffffff910;
  bool local_6e1;
  undefined4 in_stack_fffffffffffff968;
  int *boxType_00;
  undefined1 *puVar12;
  int *ratio;
  MFIter local_650;
  StateDescriptor *local_5f0;
  int in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa34;
  int in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  Real in_stack_fffffffffffffa40;
  FillPatchIterator *in_stack_fffffffffffffa48;
  undefined1 local_460 [396];
  IntVect local_2d4 [9];
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  int local_140;
  undefined1 local_13c [44];
  Geometry *local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [24];
  StateDescriptor *local_b8;
  BATType local_ac;
  undefined1 local_a8 [64];
  undefined1 *local_68;
  IntVect *local_60;
  FillPatchIterator *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_a8._8_8_ = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_ac = in_R8D;
  local_a8._0_4_ = in_ECX.m_typ.itype;
  local_a8._4_4_ = in_EDX.itype;
  local_a8._20_4_ = in_ESI;
  local_b8 = DescriptorList::operator[]
                       ((DescriptorList *)in_stack_fffffffffffff870,
                        (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
  in_RDI[0x2b].vect[1] = local_ac;
  puVar12 = local_d0;
  StateDescriptor::sameInterps
            (in_stack_fffffffffffff8c8,(int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
             (int)in_stack_fffffffffffff8c0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff880,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff880);
  ratio = in_RDI[0xb].vect + 1;
  FabArrayBase::boxArray(*(FabArrayBase **)(in_RDI[8].vect + 2));
  FabArrayBase::DistributionMap(*(FabArrayBase **)(in_RDI[8].vect + 2));
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_d8 = 0;
  MFInfo::MFInfo((MFInfo *)0x13993aa);
  this_00 = (BoxArray *)FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x13993bb)
  ;
  MultiFab::define(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                   (DistributionMapping *)
                   CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
                   (MFInfo *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (FabFactory<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  MFInfo::~MFInfo((MFInfo *)0x1399407);
  local_110 = AmrLevel::Geom(*(AmrLevel **)in_RDI[8].vect);
  boxType_00 = in_RDI[0xb].vect + 1;
  std::numeric_limits<double>::quiet_NaN();
  FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff870,(value_type)this_00,
             (Geometry *)0x1399453);
  FabArrayBase::boxArray(*(FabArrayBase **)(in_RDI[8].vect + 2));
  local_13c._32_4_ = BoxArray::ixType(this_00);
  local_13c._36_8_ = local_13c + 0x20;
  local_13c._28_4_ = *(int *)(*(long *)in_RDI[8].vect + 8);
  local_13c._24_4_ = 0;
  local_13c._20_4_ = 0;
  do {
    iVar9 = local_13c._24_4_;
    sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       (in_RDI[9].vect + 1));
    if ((int)sVar3 <= iVar9) {
      (**(code **)(**(long **)in_RDI[8].vect + 0x108))
                ((int)local_a8._8_8_,*(long **)in_RDI[8].vect,in_RDI[0xb].vect + 1,local_a8._4_4_,
                 local_a8._0_4_,0,local_ac);
      return;
    }
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI[9].vect + 1),(long)(int)local_13c._24_4_);
    local_13c._16_4_ = pvVar4->first;
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI[9].vect + 1),(long)(int)local_13c._24_4_);
    local_13c._12_4_ = pvVar4->second;
    if (local_13c._28_4_ == 0) {
      FillFromLevel0(in_stack_fffffffffffff910,
                     (Real)CONCAT17(in_stack_fffffffffffff90f,
                                    CONCAT16(in_stack_fffffffffffff90e,
                                             CONCAT15(in_stack_fffffffffffff90d,
                                                      in_stack_fffffffffffff908))),
                     (int)((ulong)in_stack_fffffffffffff900 >> 0x20),(int)in_stack_fffffffffffff900,
                     (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),(int)in_stack_fffffffffffff8f8)
      ;
    }
    else {
      if (local_13c._28_4_ != 1) {
        AmrMesh::blockingFactor((AmrMesh *)in_stack_fffffffffffff870,(int)((ulong)this_00 >> 0x20));
        StateDescriptor::interp(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
        bVar1 = ProperlyNested<amrex::InterpBase>
                          ((IntVect *)ratio,in_RDI,(int)((ulong)puVar12 >> 0x20),
                           (IndexType *)boxType_00,
                           (InterpBase *)CONCAT44(iVar9,in_stack_fffffffffffff968));
        if (!bVar1) {
          pIVar5 = EB2::TopIndexSpaceIfPresent();
          if (pIVar5 != (IndexSpace *)0x0) {
            local_a8._32_8_ = "Grids must be properly nested for EB";
            Abort_host((char *)in_stack_fffffffffffff880);
          }
          if ((Initialize::first & 1U) != 0) {
            Initialize::first = false;
            bVar1 = ParallelDescriptor::IOProcessor();
            if ((bVar1) && (iVar2 = Verbose(), iVar2 != 0)) {
              pIVar6 = AmrMesh::blockingFactor
                                 ((AmrMesh *)in_stack_fffffffffffff870,(int)((ulong)this_00 >> 0x20)
                                 );
              local_13c._0_8_ = *(undefined8 *)pIVar6->vect;
              local_13c._8_4_ = pIVar6->vect[2];
              local_68 = local_13c;
              local_a8._60_4_ = 2;
              uVar8 = local_13c._4_4_;
              local_13c._0_4_ = local_13c._0_4_ * 2;
              local_13c._4_4_ = uVar8 * 2;
              for (local_140 = 0; local_13c._8_4_ = local_13c._8_4_ * 2, local_140 < 10;
                  local_140 = local_140 + 1) {
                StateDescriptor::interp(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
                bVar1 = ProperlyNested<amrex::InterpBase>
                                  ((IntVect *)ratio,in_RDI,(int)((ulong)puVar12 >> 0x20),
                                   (IndexType *)boxType_00,
                                   (InterpBase *)CONCAT44(iVar9,in_stack_fffffffffffff968));
                if (bVar1) break;
                local_a8._48_8_ = local_13c;
                local_a8._44_4_ = 2;
                uVar8 = local_13c._4_4_;
                local_13c._0_4_ = local_13c._0_4_ * 2;
                local_13c._4_4_ = uVar8 * 2;
              }
              OutStream();
              Print::Print((Print *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           (ostream *)in_stack_fffffffffffff898);
              Print::operator<<(in_stack_fffffffffffff870,(char (*) [63])this_00);
              Print::operator<<(in_stack_fffffffffffff870,(char (*) [61])this_00);
              Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff8e4,
                                              in_stack_fffffffffffff8e0.itype));
              IntVect::IntVect(local_2d4,0x80,0x80,0x80);
              in_stack_fffffffffffff910 = (FillPatchIterator *)local_13c;
              local_60 = local_2d4;
              local_c = 2;
              local_6e1 = true;
              if (local_2d4[0].vect[2] <= (int)local_13c._8_4_) {
                local_1c = 2;
                local_6e1 = false;
                in_stack_fffffffffffff90f = local_6e1;
                local_18 = local_60;
                if (local_13c._8_4_ == local_2d4[0].vect[2]) {
                  local_2c = 1;
                  local_6e1 = true;
                  in_stack_fffffffffffff90e = local_6e1;
                  in_stack_fffffffffffff90f = local_6e1;
                  local_28 = local_60;
                  if (local_2d4[0].vect[1] <= (int)local_13c._4_4_) {
                    local_3c = 1;
                    in_stack_fffffffffffff90d = false;
                    in_stack_fffffffffffff90e = in_stack_fffffffffffff90d;
                    in_stack_fffffffffffff90f = in_stack_fffffffffffff90d;
                    local_6e1 = (bool)in_stack_fffffffffffff90d;
                    local_38 = local_60;
                    if (local_13c._4_4_ == local_2d4[0].vect[1]) {
                      local_4c = 0;
                      in_stack_fffffffffffff90d = (int)local_13c._0_4_ < local_2d4[0].vect[0];
                      in_stack_fffffffffffff90e = in_stack_fffffffffffff90d;
                      in_stack_fffffffffffff90f = in_stack_fffffffffffff90d;
                      local_6e1 = (bool)in_stack_fffffffffffff90d;
                      local_48 = local_60;
                    }
                  }
                }
              }
              local_58 = in_stack_fffffffffffff910;
              local_8 = local_60;
              if (local_6e1 == false) {
                OutStream();
                in_stack_fffffffffffff8e8 = (AmrLevel *)&stack0xfffffffffffffa18;
                Print::Print((Print *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             (ostream *)in_stack_fffffffffffff898);
                Print::operator<<(in_stack_fffffffffffff870,(char (*) [38])this_00);
                Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff8e4,
                                                in_stack_fffffffffffff8e0.itype));
              }
              else {
                OutStream();
                in_stack_fffffffffffff8f8 = local_460;
                Print::Print((Print *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             (ostream *)in_stack_fffffffffffff898);
                in_stack_fffffffffffff900 =
                     Print::operator<<(in_stack_fffffffffffff870,(char (*) [30])this_00);
                in_stack_fffffffffffff8f0 =
                     Print::operator<<(in_stack_fffffffffffff870,(IntVect *)this_00);
                Print::operator<<(in_stack_fffffffffffff870,(char (*) [2])this_00);
                Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff8e4,
                                                in_stack_fffffffffffff8e0.itype));
              }
            }
          }
          uVar8 = (undefined4)((ulong)this_00 >> 0x20);
          local_5f0 = (StateDescriptor *)0x0;
          pSVar7 = (StateDescriptor *)operator_new(0x160);
          uVar10 = *(undefined8 *)(in_RDI[8].vect + 2);
          iVar9 = local_13c._12_4_;
          iVar2 = local_a8._20_4_;
          uVar11 = local_a8._8_8_;
          in_stack_fffffffffffff8e0.itype = local_a8._4_4_;
          in_stack_fffffffffffff8e4 = local_13c._16_4_;
          in_stack_fffffffffffff870 =
               (Print *)StateDescriptor::interp(in_stack_fffffffffffff880,in_stack_fffffffffffff87c)
          ;
          this_00 = (BoxArray *)CONCAT44(uVar8,iVar9);
          FillPatchIteratorHelper::FillPatchIteratorHelper
                    ((FillPatchIteratorHelper *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0.itype)
                     ,(int)((ulong)uVar11 >> 0x20),(Real)CONCAT44(iVar2,in_stack_fffffffffffff8d0),
                     (int)((ulong)uVar10 >> 0x20),(int)uVar10,(int)in_stack_fffffffffffff900,
                     (InterpBase *)
                     CONCAT17(in_stack_fffffffffffff90f,
                              CONCAT16(in_stack_fffffffffffff90e,
                                       CONCAT15(in_stack_fffffffffffff90d,in_stack_fffffffffffff908)
                                      )));
          local_5f0 = pSVar7;
          MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898,(uchar)((ulong)in_stack_fffffffffffff890 >> 0x38)
                        );
          while (bVar1 = MFIter::isValid(&local_650), bVar1) {
            __s = &local_650;
            in_stack_fffffffffffff890 = local_5f0;
            in_stack_fffffffffffff898 =
                 (FabArrayBase *)
                 FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff870,
                            (MFIter *)this_00);
            in_stack_fffffffffffff8a4 = local_13c._20_4_;
            MFIter::index(&local_650,(char *)__s,__c);
            FillPatchIteratorHelper::fill
                      ((FillPatchIteratorHelper *)in_stack_fffffffffffffdb0,
                       (FArrayBox *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                       in_stack_fffffffffffffda0);
            MFIter::operator++(&local_650);
          }
          MFIter::~MFIter((MFIter *)in_stack_fffffffffffff870);
          in_stack_fffffffffffff880 = local_5f0;
          if (local_5f0 != (StateDescriptor *)0x0) {
            FillPatchIteratorHelper::~FillPatchIteratorHelper
                      ((FillPatchIteratorHelper *)in_stack_fffffffffffff870);
            operator_delete(in_stack_fffffffffffff880,0x160);
          }
          goto LAB_01399da9;
        }
      }
      FillFromTwoLevels(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                        in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38,
                        in_stack_fffffffffffffa34,in_stack_fffffffffffffa30);
    }
LAB_01399da9:
    local_13c._20_4_ = local_13c._12_4_ + local_13c._20_4_;
    local_13c._24_4_ = local_13c._24_4_ + 1;
  } while( true );
}

Assistant:

void
FillPatchIterator::Initialize (int  boxGrow,
                               Real time,
                               int  idx,
                               int  scomp,
                               int  ncomp)
{
    BL_PROFILE("FillPatchIterator::Initialize");

    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    const StateDescriptor& desc = AmrLevel::desc_lst[idx];

    m_ncomp = ncomp;
    m_range = desc.sameInterps(scomp,ncomp);

    m_fabs.define(m_leveldata.boxArray(),m_leveldata.DistributionMap(),
                  m_ncomp,boxGrow,MFInfo(),m_leveldata.Factory());

    const Geometry& geom = m_amrlevel.Geom();

    m_fabs.setDomainBndry(std::numeric_limits<Real>::quiet_NaN(), geom);

    const IndexType& boxType = m_leveldata.boxArray().ixType();
    const int level = m_amrlevel.level;

    for (int i = 0, DComp = 0; i < static_cast<int>(m_range.size()); i++)
    {
        const int SComp = m_range[i].first;
        const int NComp = m_range[i].second;

        if (level == 0)
        {
            FillFromLevel0(time, idx, SComp, DComp, NComp);
        }
        else
        {
            if (level == 1 ||
                amrex::ProperlyNested(m_amrlevel.crse_ratio,
                                      m_amrlevel.parent->blockingFactor(m_amrlevel.level),
                                      boxGrow, boxType, desc.interp(SComp)))
            {
                FillFromTwoLevels(time, idx, SComp, DComp, NComp);
            } else {

#ifdef AMREX_USE_EB
                if (EB2::TopIndexSpaceIfPresent()) {
                    amrex::Abort("Grids must be properly nested for EB");
                }
#endif

                static bool first = true;
                if (first) {
                    first = false;
                    if (ParallelDescriptor::IOProcessor() && amrex::Verbose()) {
                        IntVect new_blocking_factor = m_amrlevel.parent->blockingFactor(m_amrlevel.level);
                        new_blocking_factor *= 2;
                        for (int j = 0; j < 10; ++j) {
                            if (amrex::ProperlyNested(m_amrlevel.crse_ratio,
                                                      new_blocking_factor,
                                                      boxGrow, boxType, desc.interp(SComp))) {
                                break;
                            } else {
                                new_blocking_factor *= 2;
                            }
                        }
                        amrex::Print() << "WARNING: Grids are not properly nested.  We might have to use\n"
                                       << "         two coarse levels to do fillpatch.  Consider using\n";
                        if (new_blocking_factor < IntVect{AMREX_D_DECL(128,128,128)}) {
                            amrex::Print() << "         amr.blocking_factor=" << new_blocking_factor << "\n";
                        } else {
                            amrex::Print() << "         larger amr.blocking_factor.\n";
                        }
                    }
                }

                FillPatchIteratorHelper* fph = 0;
                fph = new FillPatchIteratorHelper(m_amrlevel,
                                                  m_leveldata,
                                                  boxGrow,
                                                  time,
                                                  idx,
                                                  SComp,
                                                  NComp,
                                                  desc.interp(SComp));

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(m_fabs); mfi.isValid(); ++mfi)
                {
                    fph->fill(m_fabs[mfi],DComp,mfi.index());
                }

                delete fph;
            }
        }

        DComp += NComp;
    }
    //
    // Call hack to touch up fillPatched data.
    //
    m_amrlevel.set_preferred_boundary_values(m_fabs,
                                             idx,
                                             scomp,
                                             0,
                                             ncomp,
                                             time);
}